

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O3

FRandom * FRandom::StaticFindRNG(char *name)

{
  uint uVar1;
  size_t sVar2;
  FRandom *pFVar3;
  
  sVar2 = strlen(name);
  uVar1 = crc32(0,name,sVar2 & 0xffffffff);
  pFVar3 = RNGList;
  if (uVar1 == 0) {
    pFVar3 = &pr_exrandom;
  }
  else {
    for (; pFVar3 != (FRandom *)0x0; pFVar3 = pFVar3->Next) {
      if (uVar1 <= pFVar3->NameCRC) {
        if (pFVar3->NameCRC == uVar1) {
          return pFVar3;
        }
        break;
      }
    }
    pFVar3 = (FRandom *)operator_new(0x70);
    FRandom(pFVar3,name);
    TArray<FRandom_*,_FRandom_*>::Grow(&NewRNGs.super_TArray<FRandom_*,_FRandom_*>,1);
    NewRNGs.super_TArray<FRandom_*,_FRandom_*>.Array
    [NewRNGs.super_TArray<FRandom_*,_FRandom_*>.Count] = pFVar3;
    NewRNGs.super_TArray<FRandom_*,_FRandom_*>.Count =
         NewRNGs.super_TArray<FRandom_*,_FRandom_*>.Count + 1;
  }
  return pFVar3;
}

Assistant:

FRandom *FRandom::StaticFindRNG (const char *name)
{
	DWORD NameCRC = CalcCRC32 ((const BYTE *)name, (unsigned int)strlen (name));

	// Use the default RNG if this one happens to have a CRC of 0.
	if (NameCRC == 0) return &pr_exrandom;

	// Find the RNG in the list, sorted by CRC
	FRandom **prev = &RNGList, *probe = RNGList;

	while (probe != NULL && probe->NameCRC < NameCRC)
	{
		prev = &probe->Next;
		probe = probe->Next;
	}
	// Found one so return it.
	if (probe == NULL || probe->NameCRC != NameCRC)
	{
		// A matching RNG doesn't exist yet so create it.
		probe = new FRandom(name);

		// Store the new RNG for destruction when ZDoom quits.
		NewRNGs.Push(probe);
	}
	return probe;
}